

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-make.c
# Opt level: O0

object_kind * money_kind(char *name,wchar_t value)

{
  ushort uVar1;
  int iVar2;
  object_kind *poVar3;
  wchar_t local_18;
  wchar_t max_gold_drop;
  wchar_t rank;
  wchar_t value_local;
  char *name_local;
  
  uVar1 = z_info->max_depth;
  local_18 = L'\0';
  while ((local_18 < num_money_types && (iVar2 = strcmp(name,money_type[local_18].name), iVar2 != 0)
         )) {
    local_18 = local_18 + L'\x01';
  }
  if (local_18 == num_money_types) {
    local_18 = (((value * 100) / (int)((uint)uVar1 * 3 + 0x1e)) * num_money_types) / 100;
  }
  if (num_money_types <= local_18) {
    local_18 = num_money_types + L'\xffffffff';
  }
  poVar3 = lookup_kind(L'#',money_type[local_18].type);
  return poVar3;
}

Assistant:

struct object_kind *money_kind(const char *name, int value)
{
	int rank;
	/* (Roughly) the largest possible gold drop at max depth - the precise
	 * value is derivable from the calculations in make_gold(), but this is
	 * near enough */
	int max_gold_drop = 3 * z_info->max_depth + 30;

	/* Check for specified treasure variety */
	for (rank = 0; rank < num_money_types; rank++)
		if (streq(name, money_type[rank].name))
			break;

	/* Pick a treasure variety scaled by level */
	if (rank == num_money_types)
		rank = (((value * 100) / max_gold_drop) * num_money_types) / 100;

	/* Do not create illegal treasure types */
	if (rank >= num_money_types) rank = num_money_types - 1;

	return lookup_kind(TV_GOLD, money_type[rank].type);
}